

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models.cpp
# Opt level: O0

FModelVertex * __thiscall FModelVertexBuffer::LockVertexBuffer(FModelVertexBuffer *this,uint size)

{
  ulong uVar1;
  FModelVertex *pFVar2;
  uint size_local;
  FModelVertexBuffer *this_local;
  
  if ((this->super_FVertexBuffer).vbo_id == 0) {
    if ((this->vbo_ptr != (FModelVertex *)0x0) && (this->vbo_ptr != (FModelVertex *)0x0)) {
      operator_delete__(this->vbo_ptr);
    }
    uVar1 = SUB168(ZEXT416(size) * ZEXT816(0x14),0);
    if (SUB168(ZEXT416(size) * ZEXT816(0x14),8) != 0) {
      uVar1 = 0xffffffffffffffff;
    }
    pFVar2 = (FModelVertex *)operator_new__(uVar1);
    this->vbo_ptr = pFVar2;
    memset(this->vbo_ptr,0,(ulong)size * 0x14);
    this_local = (FModelVertexBuffer *)this->vbo_ptr;
  }
  else {
    (*_ptrc_glBindBuffer)(0x8892,(this->super_FVertexBuffer).vbo_id);
    (*_ptrc_glBufferData)(0x8892,(ulong)size * 0x14,(void *)0x0,0x88e4);
    if ((gl.legacyMode & 1U) == 0) {
      this_local = (FModelVertexBuffer *)(*_ptrc_glMapBufferRange)(0x8892,0,(ulong)size * 0x14,10);
    }
    else {
      this_local = (FModelVertexBuffer *)(*_ptrc_glMapBuffer)(0x8892,0x88b9);
    }
  }
  return (FModelVertex *)this_local;
}

Assistant:

FModelVertex *FModelVertexBuffer::LockVertexBuffer(unsigned int size)
{
	if (vbo_id > 0)
	{
		glBindBuffer(GL_ARRAY_BUFFER, vbo_id);
		glBufferData(GL_ARRAY_BUFFER, size * sizeof(FModelVertex), nullptr, GL_STATIC_DRAW);
		if (!gl.legacyMode)
			return (FModelVertex*)glMapBufferRange(GL_ARRAY_BUFFER, 0, size * sizeof(FModelVertex), GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT);
		else
			return (FModelVertex*)glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY);
	}
	else
	{
		if (vbo_ptr != nullptr) delete[] vbo_ptr;
		vbo_ptr = new FModelVertex[size];
		memset(vbo_ptr, 0, size * sizeof(FModelVertex));
		return vbo_ptr;
	}
}